

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildRender8bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uchar in_marker_pixel_value)

{
  uchar *puVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if (0 < h) {
    iVar3 = atlas->TexWidth;
    puVar1 = atlas->TexPixelsAlpha8 + (long)(y * iVar3) + (long)x;
    iVar4 = 0;
    do {
      if (0 < w) {
        uVar5 = 0;
        do {
          uVar2 = in_marker_pixel_value;
          if (in_str[uVar5] != in_marker_char) {
            uVar2 = '\0';
          }
          puVar1[uVar5] = uVar2;
          uVar5 = uVar5 + 1;
        } while ((uint)w != uVar5);
        iVar3 = atlas->TexWidth;
      }
      iVar4 = iVar4 + 1;
      puVar1 = puVar1 + iVar3;
      in_str = in_str + w;
    } while (iVar4 != h);
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender8bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned char in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned char* out_pixel = atlas->TexPixelsAlpha8 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : 0x00;
}